

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O2

BoundedType * __thiscall BoundedType::Get(BoundedType *this,int32_t max_val)

{
  pointer this_00;
  templated_unique_single_t info;
  unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_> local_80;
  string local_78 [32];
  allocator local_58 [64];
  
  duckdb::LogicalType::LogicalType((LogicalType *)this,INTEGER);
  std::__cxx11::string::string(local_78,"BOUNDED",local_58);
  duckdb::LogicalType::SetAlias(this,local_78);
  std::__cxx11::string::~string(local_78);
  duckdb::make_uniq<duckdb::ExtensionTypeInfo>();
  this_00 = duckdb::
            unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
            ::operator->(&info);
  duckdb::Value::INTEGER((int)local_58);
  std::vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>::
  emplace_back<duckdb::Value>
            ((vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
             this_00,(Value *)local_58);
  duckdb::Value::~Value((Value *)local_58);
  local_80._M_t.
  super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
  .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl =
       (__uniq_ptr_data<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true,_true>
        )(__uniq_ptr_data<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true,_true>
          )info.
           super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
           .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl;
  info.super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
  .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>)
       (__uniq_ptr_data<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true,_true>
        )0x0;
  duckdb::LogicalType::SetExtensionInfo(this);
  std::unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>::
  ~unique_ptr(&local_80);
  std::unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>::
  ~unique_ptr(&info.
               super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
             );
  return this;
}

Assistant:

static LogicalType Get(int32_t max_val) {
		auto type = LogicalType(LogicalTypeId::INTEGER);
		type.SetAlias("BOUNDED");
		auto info = make_uniq<ExtensionTypeInfo>();
		info->modifiers.emplace_back(Value::INTEGER(max_val));
		type.SetExtensionInfo(std::move(info));
		return type;
	}